

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

QBitArray * sizedForOverwrite(QBitArray *__return_storage_ptr__,QBitArray *a1,QBitArray *a2)

{
  char cVar1;
  long lVar2;
  char cVar3;
  long capacity;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char> local_50;
  QBitArray *local_38;
  
  local_38 = *(QBitArray **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.size = 0;
  lVar4 = (a1->d).d.size;
  lVar2 = (a2->d).d.size;
  capacity = lVar2;
  if (lVar2 < lVar4) {
    capacity = lVar4;
  }
  local_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_50.ptr = (char *)QArrayData::allocate1((QArrayData **)&local_50,capacity,KeepSize);
  if (lVar2 < lVar4) {
    cVar3 = *(a1->d).d.ptr;
  }
  else if (lVar4 < lVar2) {
    lVar4 = lVar2;
    cVar3 = *(a2->d).d.ptr;
  }
  else {
    if (lVar4 == 0) goto LAB_00353a12;
    cVar1 = *(a1->d).d.ptr;
    cVar3 = *(a2->d).d.ptr;
    if (cVar1 < cVar3) {
      cVar3 = cVar1;
    }
  }
  *local_50.ptr = cVar3;
  local_50.ptr[lVar4] = '\0';
LAB_00353a12:
  local_50.size = capacity;
  QArrayDataPointer<char>::operator=((QArrayDataPointer<char> *)__return_storage_ptr__,&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(QBitArray **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QBitArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QBitArray sizedForOverwrite(const QBitArray &a1, const QBitArray &a2)
{
    QBitArray result;
    const QByteArrayData &d1 = a1.data_ptr();
    const QByteArrayData &d2 = a2.data_ptr();
    qsizetype n1 = d1.size;
    qsizetype n2 = d2.size;
    qsizetype n = qMax(n1, n2);

    QByteArrayData bytes(n, n);

    // initialize the count of bits in the last byte (see construction note)
    // and the QByteArray null termination (some of our algorithms read it)
    if (n1 > n2) {
        *bytes.ptr = *d1.ptr;
        bytes.ptr[n1] = 0;
    } else if (n2 > n1) {
        *bytes.ptr = *d2.ptr;
        bytes.ptr[n2] = 0;
    } else if (n1) {    // n1 == n2
        *bytes.ptr = qMin(*d1.ptr, *d2.ptr);
        bytes.ptr[n1] = 0;
    }

    result.data_ptr() = std::move(bytes);
    return result;
}